

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd_array.cpp
# Opt level: O3

void __thiscall
NshCmdArrayFindMatching_Success_Test::TestBody(NshCmdArrayFindMatching_Success_Test *this)

{
  nsh_status_t nVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  char *pcVar3;
  nsh_cmd_t *cmd;
  nsh_cmd_array_t cmds;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_338;
  internal local_330 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_320;
  AssertHelper local_318;
  nsh_cmd_array_t local_310;
  
  local_320._M_head_impl._0_4_ = nsh_cmd_array_init(&local_310);
  local_338._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_338._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<nsh_status,nsh_status>
            (local_330,"nsh_cmd_array_init(&cmds)","NSH_STATUS_OK",(nsh_status *)&local_320,
             (nsh_status *)&local_338);
  if (local_330[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_320);
    if (local_328 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_328->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
               ,0x46,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_320);
LAB_00116bd5:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    _Var2._M_head_impl = local_320._M_head_impl;
  }
  else {
    if (local_328 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_328,local_328);
    }
    nVar1 = nsh_cmd_array_register(&local_310,"cmd1_test",cmd_test_handler);
    local_320._M_head_impl._0_4_ = nVar1;
    local_338._M_head_impl = local_338._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<nsh_status,nsh_status>
              (local_330,"nsh_cmd_array_register(&cmds, \"cmd1_test\", &cmd_test_handler)",
               "NSH_STATUS_OK",(nsh_status *)&local_320,(nsh_status *)&local_338);
    if (local_330[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_320);
      if (local_328 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_328->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_338,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                 ,0x48,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_320);
      goto LAB_00116bd5;
    }
    if (local_328 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_328,local_328);
    }
    nVar1 = nsh_cmd_array_register(&local_310,"cmd2_test",cmd_test_handler);
    local_320._M_head_impl._0_4_ = nVar1;
    local_338._M_head_impl = local_338._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<nsh_status,nsh_status>
              (local_330,"nsh_cmd_array_register(&cmds, \"cmd2_test\", &cmd_test_handler)",
               "NSH_STATUS_OK",(nsh_status *)&local_320,(nsh_status *)&local_338);
    if (local_330[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_320);
      if (local_328 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_328->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_338,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                 ,0x49,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_320);
      goto LAB_00116bd5;
    }
    if (local_328 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_328,local_328);
    }
    nVar1 = nsh_cmd_array_register(&local_310,"cmd3_test",cmd_test_handler);
    local_320._M_head_impl._0_4_ = nVar1;
    local_338._M_head_impl = local_338._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<nsh_status,nsh_status>
              (local_330,"nsh_cmd_array_register(&cmds, \"cmd3_test\", &cmd_test_handler)",
               "NSH_STATUS_OK",(nsh_status *)&local_320,(nsh_status *)&local_338);
    if (local_330[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_320);
      if (local_328 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_328->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_338,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                 ,0x4a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_320);
      goto LAB_00116bd5;
    }
    if (local_328 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_328,local_328);
    }
    local_320._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         nsh_cmd_array_find_matching(&local_310,"cmd2_",5);
    local_338._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<nsh_cmd_const*,decltype(nullptr)>
              (local_330,"cmd","nullptr",(nsh_cmd **)&local_320,&local_338._M_head_impl);
    if (local_330[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_338);
      if (local_328 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_328->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                 ,0x4f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_338);
    }
    else {
      if (local_328 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_328,local_328);
      }
      testing::internal::CmpHelperSTREQ
                (local_330,"cmd->name","\"cmd2_test\"",(char *)(local_320._M_head_impl + 8),
                 "cmd2_test");
      if (local_330[0] != (internal)0x0) goto LAB_00116bed;
      testing::Message::Message((Message *)&local_338);
      if (local_328 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_328->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                 ,0x50,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_338);
    }
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    _Var2._M_head_impl = local_338._M_head_impl;
  }
  if ((nsh_cmd_t *)_Var2._M_head_impl != (nsh_cmd_t *)0x0) {
    (**(code **)(((nsh_cmd_t *)_Var2._M_head_impl)->handler + 8))();
  }
LAB_00116bed:
  if (local_328 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_328,local_328);
  }
  return;
}

Assistant:

TEST(NshCmdArrayFindMatching, Success)
{
    nsh_cmd_array_t cmds;
    ASSERT_EQ(nsh_cmd_array_init(&cmds), NSH_STATUS_OK);

    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd1_test", &cmd_test_handler), NSH_STATUS_OK);
    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd2_test", &cmd_test_handler), NSH_STATUS_OK);
    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd3_test", &cmd_test_handler), NSH_STATUS_OK);

    static constexpr const char searched_for[] = "cmd2_";
    auto* cmd = nsh_cmd_array_find_matching(&cmds, searched_for, sizeof(searched_for) - 1);

    ASSERT_NE(cmd, nullptr);
    ASSERT_STREQ(cmd->name, "cmd2_test");
}